

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void take_hit(player *p,wchar_t dam,char *kb_str)

{
  uint32_t *puVar1;
  short sVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  char *fmt;
  
  iVar7 = (int)((uint)(p->opts).hitpoint_warn * (int)p->mhp) / 10;
  if (dam < L'\x01') {
    return;
  }
  if (p->is_dead == false) {
    sVar2 = p->chp;
    disturb(p);
    p->chp = p->chp - (short)dam;
    _Var3 = flag_has_dbg((p->state).pflags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)");
    if ((((_Var3) && (iVar4 = strcmp(kb_str,"poison"), iVar4 != 0)) &&
        (iVar4 = strcmp(kb_str,"a fatal wound"), iVar4 != 0)) &&
       (iVar4 = strcmp(kb_str,"starvation"), iVar4 != 0)) {
      iVar4._0_2_ = p->msp;
      iVar4._2_2_ = p->csp;
      iVar5 = 0xa0000;
      if (9 < (short)(undefined2)iVar4) {
        iVar5 = iVar4 << 0x10;
      }
      player_adjust_mana_precise(p,dam * (iVar5 / (int)p->mhp));
    }
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x40;
    if (p->chp < 0) {
      if ((p->timed[0x31] == 0) || ((int)p->lev + (int)p->timed[0x31] + (int)p->chp < 0)) {
        my_strcpy(p->died_from,kb_str,0x50);
        if (((p->wizard == false) && ((p->opts).opt[0x1c] != true)) ||
           (_Var3 = get_check("Die? "), _Var3)) {
          msgt(8,"You die.");
          event_signal(EVENT_MESSAGE_FLUSH);
          p->total_winner = 0;
          p->is_dead = true;
          return;
        }
        event_signal(EVENT_CHEAT_DEATH);
      }
      else {
        uVar6 = Rand_div(10);
        if (uVar6 == 0) {
          msg("So great was his prowess and skill in warfare, the Elves said: ");
          fmt = "\'The Mormegil cannot be slain, save by mischance.\'";
        }
        else {
          fmt = "Your lust for blood keeps you alive!";
        }
        msg(fmt);
      }
    }
    if (iVar7 <= p->chp) {
      return;
    }
    if (iVar7 < sVar2) {
      bell();
    }
    msgt(0x1e,"*** LOW HITPOINT WARNING! ***");
    event_signal(EVENT_MESSAGE_FLUSH);
    return;
  }
  return;
}

Assistant:

void take_hit(struct player *p, int dam, const char *kb_str)
{
	int old_chp = p->chp;

	int warning = (p->mhp * p->opts.hitpoint_warn / 10);

	/* Paranoia */
	if (p->is_dead || dam <= 0) return;

	/* Disturb */
	disturb(p);

	/* Hurt the player */
	p->chp -= dam;

	/* Reward COMBAT_REGEN characters with mana for their lost hitpoints
	 * Unenviable task of separating what should and should not cause rage
	 * If we eliminate the most exploitable cases it should be fine.
	 * All traps and lava currently give mana, which could be exploited  */
	if (player_has(p, PF_COMBAT_REGEN)  && !streq(kb_str, "poison")
		&& !streq(kb_str, "a fatal wound") && !streq(kb_str, "starvation")) {
		/* lose X% of hitpoints get X% of spell points */
		int32_t sp_gain = (((int32_t)MAX(p->msp, 10)) * 65536)
			/ (int32_t)p->mhp * dam;
		player_adjust_mana_precise(p, sp_gain);
	}

	/* Display the hitpoints */
	p->upkeep->redraw |= (PR_HP);

	/* Dead player */
	if (p->chp < 0) {
		/* From hell's heart I stab at thee */
		if (p->timed[TMD_BLOODLUST]
			&& (p->chp + p->timed[TMD_BLOODLUST] + p->lev >= 0)) {
			if (randint0(10)) {
				msg("Your lust for blood keeps you alive!");
			} else {
				msg("So great was his prowess and skill in warfare, the Elves said: ");
				msg("'The Mormegil cannot be slain, save by mischance.'");
			}
		} else {
			/*
			 * Note cause of death.  Do it here so EVENT_CHEAT_DEATH
			 * handlers or things looking for the "Die? " prompt
			 * (the borg, for instance), have access to it.
			 */
			my_strcpy(p->died_from, kb_str, sizeof(p->died_from));

			if ((p->wizard || OPT(p, cheat_live))
					&& !get_check("Die? ")) {
				event_signal(EVENT_CHEAT_DEATH);
			} else {
				/* Hack -- Note death */
				msgt(MSG_DEATH, "You die.");
				event_signal(EVENT_MESSAGE_FLUSH);

				/* No longer a winner */
				p->total_winner = false;

				/* Note death */
				p->is_dead = true;

				/* Dead */
				return;
			}
		}
	}

	/* Hitpoint warning */
	if (p->chp < warning) {
		/* Hack -- bell on first notice */
		if (old_chp > warning)
			bell();

		/* Message */
		msgt(MSG_HITPOINT_WARN, "*** LOW HITPOINT WARNING! ***");
		event_signal(EVENT_MESSAGE_FLUSH);
	}
}